

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_trie_match(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  ulong uVar2;
  nn_trie_node **ppnVar3;
  nn_trie_node *self_00;
  ulong uVar4;
  
  self_00 = self->root;
  if (self_00 == (nn_trie_node *)0x0) {
    return 0;
  }
  do {
    bVar1 = self_00->prefix_len;
    uVar4 = (ulong)bVar1;
    uVar2 = 0;
    if (bVar1 == 0) {
LAB_0012a5aa:
      if ((uint)uVar2 != (uint)bVar1) {
        return 0;
      }
      uVar4 = (ulong)(uint)bVar1;
    }
    else {
      uVar2 = 0;
      do {
        if (size == uVar2) {
          uVar2 = size & 0xffffffff;
          goto LAB_0012a5aa;
        }
        if (self_00->prefix[uVar2] != data[uVar2]) goto LAB_0012a5aa;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    if (self_00->refcount != 0) {
      return 1;
    }
    ppnVar3 = nn_node_next(self_00,data[uVar4]);
    if (ppnVar3 == (nn_trie_node **)0x0) {
      return 0;
    }
    self_00 = *ppnVar3;
    data = data + uVar4 + 1;
    size = size + ~uVar4;
    if (self_00 == (nn_trie_node *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

int nn_trie_match (struct nn_trie *self, const uint8_t *data, size_t size)
{
    struct nn_trie_node *node;
    struct nn_trie_node **tmp;

    node = self->root;
    while (1) {

        /*  If we are at the end of the trie, return. */
        if (!node)
            return 0;

        /*  Check whether whole prefix matches the data. If not so,
            the whole string won't match. */
        if (nn_node_check_prefix (node, data, size) != node->prefix_len)
            return 0;

        /*  Skip the prefix. */
        data += node->prefix_len;
        size -= node->prefix_len;

        /*  If all the data are matched, return. */
        if (nn_node_has_subscribers (node))
            return 1;

        /*  Move to the next node. */
        tmp = nn_node_next (node, *data);
        node = tmp ? *tmp : NULL;
        ++data;
        --size;
    }
}